

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int JetHead::File::pipe(int *__pipedes)

{
  int iVar1;
  int *piVar2;
  File *pFVar3;
  int local_20;
  int res;
  int fds [2];
  File **pipe_files_local;
  
  fds = (int  [2])__pipedes;
  iVar1 = ::pipe(&local_20);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pipe_files_local._4_4_ = getErrorCode(*piVar2);
  }
  else {
    pFVar3 = (File *)operator_new(0x40,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/File.cpp"
                                  ,0x137);
    File(pFVar3,local_20);
    *(File **)fds = pFVar3;
    pFVar3 = (File *)operator_new(0x40,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/File.cpp"
                                  ,0x138);
    File(pFVar3,res);
    *(File **)((long)fds + 8) = pFVar3;
    pipe_files_local._4_4_ = kNoError;
  }
  return pipe_files_local._4_4_;
}

Assistant:

JetHead::ErrCode	File::pipe( File *pipe_files[ 2 ] )
{
	int fds[ 2 ];
	int res = ::pipe( fds );

	if ( res == -1 )
		return 	getErrorCode( errno );

	pipe_files[ 0 ] = jh_new File( fds[ 0 ] );
	pipe_files[ 1 ] = jh_new File( fds[ 1 ] );

	return kNoError;
}